

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O3

cTValue * lj_ir_k64_find(jit_State *J,uint64_t u64)

{
  uint uVar1;
  uint uVar2;
  TValue *tv;
  cTValue *pcVar3;
  ulong uVar4;
  cTValue *pcVar5;
  
  uVar1 = (J->k64).ptr32;
  uVar2 = uVar1;
  if (uVar1 == 0) {
    pcVar5 = (cTValue *)0x0;
  }
  else {
    do {
      pcVar3 = (cTValue *)(ulong)uVar2;
      pcVar5 = pcVar3;
      for (uVar4 = (ulong)(pcVar3->field_2).it; uVar4 != 0; uVar4 = uVar4 - 1) {
        pcVar5 = pcVar5 + 1;
        if (pcVar5->u64 == u64) {
          return pcVar5;
        }
      }
      uVar2 = (pcVar3->u32).lo;
    } while ((pcVar3->u32).lo != 0);
    uVar2 = (pcVar3->field_2).it;
    pcVar5 = pcVar3;
    if (uVar2 < 0x10) goto LAB_0012918f;
  }
  uVar2 = 0;
  pcVar3 = (cTValue *)lj_mem_realloc(J->L,(void *)0x0,0,0x88);
  pcVar3->u64 = 0;
  if (uVar1 == 0) {
    (J->k64).ptr32 = (uint32_t)pcVar3;
  }
  else {
    (pcVar5->u32).lo = (uint32_t)pcVar3;
  }
LAB_0012918f:
  (pcVar3->field_2).it = uVar2 + 1;
  pcVar3[(ulong)uVar2 + 1].u64 = u64;
  return pcVar3 + (ulong)uVar2 + 1;
}

Assistant:

cTValue *lj_ir_k64_find(jit_State *J, uint64_t u64)
{
  K64Array *k, *kp = NULL;
  TValue *ntv;
  MSize idx;
  /* Search for the constant in the whole chain of arrays. */
  for (k = mref(J->k64, K64Array); k; k = mref(k->next, K64Array)) {
    kp = k;  /* Remember previous element in list. */
    for (idx = 0; idx < k->numk; idx++) {  /* Search one array. */
      TValue *tv = &k->k[idx];
      if (tv->u64 == u64)  /* Needed for +-0/NaN/absmask. */
	return tv;
    }
  }
  /* Constant was not found, need to add it. */
  if (!(kp && kp->numk < LJ_MIN_K64SZ)) {  /* Allocate a new array. */
    K64Array *kn = lj_mem_newt(J->L, sizeof(K64Array), K64Array);
    setmref(kn->next, NULL);
    kn->numk = 0;
    if (kp)
      setmref(kp->next, kn);  /* Chain to the end of the list. */
    else
      setmref(J->k64, kn);  /* Link first array. */
    kp = kn;
  }
  ntv = &kp->k[kp->numk++];  /* Add to current array. */
  ntv->u64 = u64;
  return ntv;
}